

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

int __thiscall cashew::JSPrinter::getPrecedence(JSPrinter *this,Ref node,bool parent)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  Ref *pRVar5;
  IString *pIVar6;
  IString op;
  IString op_00;
  IString op_01;
  IString op_02;
  IString op_03;
  int local_88;
  Ref local_40;
  Ref type;
  bool parent_local;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pVVar4 = Ref::operator->((Ref *)&this_local);
  bVar2 = cashew::Value::isAssign(pVVar4);
  if (!bVar2) {
    pVVar4 = Ref::operator->((Ref *)&this_local);
    bVar2 = cashew::Value::isAssignName(pVVar4);
    if (!bVar2) {
      pVVar4 = Ref::operator->((Ref *)&this_local);
      bVar2 = cashew::Value::isArray(pVVar4);
      if (!bVar2) {
        return -1;
      }
      pRVar5 = Ref::operator[]((Ref *)&this_local,0);
      local_40.inst = pRVar5->inst;
      bVar2 = Ref::operator==(&local_40,(IString *)BINARY);
      if ((bVar2) || (bVar2 = Ref::operator==(&local_40,(IString *)UNARY_PREFIX), bVar2)) {
        bVar2 = Ref::operator==(&local_40,(IString *)BINARY);
        pRVar5 = Ref::operator[]((Ref *)&this_local,1);
        pVVar4 = Ref::operator->(pRVar5);
        pIVar6 = cashew::Value::getIString(pVVar4);
        pcVar1 = (char *)(pIVar6->str)._M_len;
        op_00.str._M_str = pcVar1;
        op_00.str._M_len = (size_t)(pIVar6->str)._M_str;
        iVar3 = OperatorClass::getPrecedence((OperatorClass *)(ulong)!bVar2,(Type)pcVar1,op_00);
        return iVar3;
      }
      bVar2 = Ref::operator==(&local_40,(IString *)SEQ);
      if (bVar2) {
        op_01.str._M_str = COMMA;
        op_01.str._M_len = DAT_03193390;
        iVar3 = OperatorClass::getPrecedence((OperatorClass *)0x0,(Type)COMMA,op_01);
        return iVar3;
      }
      bVar2 = Ref::operator==(&local_40,(IString *)CALL);
      if (!bVar2) {
        bVar2 = Ref::operator==(&local_40,(IString *)CONDITIONAL);
        if (!bVar2) {
          return -1;
        }
        op_03.str._M_str = QUESTION;
        op_03.str._M_len = DAT_031933a0;
        iVar3 = OperatorClass::getPrecedence((OperatorClass *)0x3,(Type)QUESTION,op_03);
        return iVar3;
      }
      if (parent) {
        op_02.str._M_str = COMMA;
        op_02.str._M_len = DAT_03193390;
        local_88 = OperatorClass::getPrecedence((OperatorClass *)0x0,(Type)COMMA,op_02);
      }
      else {
        local_88 = -1;
      }
      return local_88;
    }
  }
  type.inst = SET;
  op.str._M_str = (char *)SET;
  op.str._M_len = DAT_03193440;
  iVar3 = OperatorClass::getPrecedence((OperatorClass *)0x0,(Type)SET,op);
  return iVar3;
}

Assistant:

int getPrecedence(Ref node, bool parent) {
    if (node->isAssign() || node->isAssignName()) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, SET);
    }
    if (!node->isArray()) {
      // node is a value
      return -1;
    }
    Ref type = node[0];
    if (type == BINARY || type == UNARY_PREFIX) {
      return OperatorClass::getPrecedence(
        type == BINARY ? OperatorClass::Binary : OperatorClass::Prefix,
        node[1]->getIString());
    } else if (type == SEQ) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, COMMA);
    } else if (type == CALL) {
      // call arguments are split by commas, but call itself is safe
      return parent ? OperatorClass::getPrecedence(OperatorClass::Binary, COMMA)
                    : -1;
    } else if (type == CONDITIONAL) {
      return OperatorClass::getPrecedence(OperatorClass::Tertiary, QUESTION);
    }
    // otherwise, this is something that fixes precedence explicitly, and we can
    // ignore
    return -1; // XXX
  }